

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O3

VertexId __thiscall
S2Builder::EdgeChainSimplifier::FollowChain(EdgeChainSimplifier *this,VertexId v0,VertexId v1)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  S2LogMessage SStack_18;
  
  uVar4 = (ulong)v1;
  iVar5 = v1 + 0x3f;
  if (-1 < v1) {
    iVar5 = v1;
  }
  if (((this->is_interior_).super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
       [(long)(iVar5 >> 6) +
        (ulong)((uVar4 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
       (uVar4 & 0x3f) & 1) == 0) {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
               ,0x63c,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: is_interior_[v1] ",0x1f);
  }
  else {
    piVar3 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar5 = piVar3[uVar4];
    iVar1 = piVar3[uVar4 + 1];
    if (iVar1 != iVar5) {
      lVar6 = 0;
      do {
        iVar2 = (this->g_->edges_->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_start[iVar5 + lVar6].second;
        if (iVar2 != v1 && iVar2 != v0) {
          return iVar2;
        }
        lVar6 = lVar6 + 1;
      } while (iVar1 - iVar5 != (int)lVar6);
    }
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
               ,0x641,kFatal,(ostream *)&std::cerr);
    std::operator<<(SStack_18.stream_,"Could not find next edge in edge chain");
  }
  abort();
}

Assistant:

S2Builder::Graph::VertexId S2Builder::EdgeChainSimplifier::FollowChain(
    VertexId v0, VertexId v1) const {
  S2_DCHECK(is_interior_[v1]);
  for (EdgeId e : out_.edge_ids(v1)) {
    VertexId v = g_.edge(e).second;
    if (v != v0 && v != v1) return v;
  }
  S2_LOG(FATAL) << "Could not find next edge in edge chain";
}